

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenSIMDLoad(BinaryenModuleRef module,BinaryenOp op,uint32_t offset,uint32_t align,
                BinaryenExpressionRef ptr,char *memoryName)

{
  SIMDLoad *pSVar1;
  Address offset_00;
  Address align_00;
  Builder local_48;
  IString local_40;
  
  offset_00.addr._4_4_ = 0;
  offset_00.addr._0_4_ = offset;
  align_00.addr._4_4_ = 0;
  align_00.addr._0_4_ = align;
  local_48.wasm = module;
  local_40.str = (string_view)getMemoryName(module,memoryName);
  pSVar1 = wasm::Builder::makeSIMDLoad(&local_48,op,offset_00,align_00,ptr,(Name)local_40.str);
  return (BinaryenExpressionRef)pSVar1;
}

Assistant:

BinaryenExpressionRef BinaryenSIMDLoad(BinaryenModuleRef module,
                                       BinaryenOp op,
                                       uint32_t offset,
                                       uint32_t align,
                                       BinaryenExpressionRef ptr,
                                       const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeSIMDLoad(SIMDLoadOp(op),
                    Address(offset),
                    Address(align),
                    (Expression*)ptr,
                    getMemoryName(module, memoryName)));
}